

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O0

bool Assimp::PLY::DOM::SkipLine(vector<char,_std::allocator<char>_> *buffer)

{
  char *this;
  bool bVar1;
  char *local_70;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_60;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_58;
  const_iterator local_50;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  const_iterator local_40;
  long local_38;
  uintptr_t iDiff;
  char *szCur;
  char *pcStack_20;
  bool ret;
  char *pCur;
  vector<char,_std::allocator<char>_> *buffer_local;
  
  pCur = (char *)buffer;
  bVar1 = std::vector<char,_std::allocator<char>_>::empty(buffer);
  if (bVar1) {
    local_70 = (char *)0x0;
  }
  else {
    local_70 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)pCur,0);
  }
  pcStack_20 = local_70;
  szCur._7_1_ = 0;
  if (local_70 == (char *)0x0) {
    buffer_local._7_1_ = false;
  }
  else {
    iDiff = (uintptr_t)local_70;
    szCur._7_1_ = SkipLine<char>(local_70,&stack0xffffffffffffffe0);
    this = pCur;
    local_38 = (long)pcStack_20 - iDiff;
    local_48._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(pCur);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_40,
               &local_48);
    local_60._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(pCur);
    local_58 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator+(&local_60,local_38);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_50,
               &local_58);
    std::vector<char,_std::allocator<char>_>::erase
              ((vector<char,_std::allocator<char>_> *)this,local_40,local_50);
    buffer_local._7_1_ = (bool)(szCur._7_1_ & 1);
  }
  return buffer_local._7_1_;
}

Assistant:

bool PLY::DOM::SkipLine(std::vector<char> &buffer)
{
  const char* pCur = buffer.empty() ? NULL : (char*)&buffer[0];
  bool ret = false;
  if (pCur)
  {
    const char* szCur = pCur;
    ret = Assimp::SkipLine(pCur, &pCur);

    uintptr_t iDiff = (uintptr_t)pCur - (uintptr_t)szCur;
    buffer.erase(buffer.begin(), buffer.begin() + iDiff);
    return ret;
  }

  return ret;
}